

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O0

void asn1_type_cleanup(ASN1_TYPE *a)

{
  int iVar1;
  ASN1_TYPE *a_local;
  
  iVar1 = a->type;
  if (iVar1 == 1) {
    (a->value).boolean = -1;
  }
  else if (iVar1 == 5) {
    (a->value).ptr = (char *)0x0;
  }
  else if (iVar1 == 6) {
    ASN1_OBJECT_free((ASN1_OBJECT *)(a->value).asn1_string);
    (a->value).ptr = (char *)0x0;
  }
  else {
    ASN1_STRING_free((ASN1_STRING *)(a->value).asn1_string);
    (a->value).ptr = (char *)0x0;
  }
  return;
}

Assistant:

void asn1_type_cleanup(ASN1_TYPE *a) {
  switch (a->type) {
    case V_ASN1_NULL:
      a->value.ptr = NULL;
      break;
    case V_ASN1_BOOLEAN:
      a->value.boolean = ASN1_BOOLEAN_NONE;
      break;
    case V_ASN1_OBJECT:
      ASN1_OBJECT_free(a->value.object);
      a->value.object = NULL;
      break;
    default:
      ASN1_STRING_free(a->value.asn1_string);
      a->value.asn1_string = NULL;
      break;
  }
}